

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGUseElement::build(SVGUseElement *this)

{
  bool bVar1;
  Document *document;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> local_28;
  undefined1 local_20 [8];
  unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> newElement;
  SVGElement *targetElement;
  SVGUseElement *this_local;
  
  document = SVGNode::document((SVGNode *)this);
  newElement._M_t.
  super___uniq_ptr_impl<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_>._M_t.
  super__Tuple_impl<0UL,_lunasvg::SVGElement_*,_std::default_delete<lunasvg::SVGElement>_>.
  super__Head_base<0UL,_lunasvg::SVGElement_*,_false>._M_head_impl =
       (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>)
       SVGURIReference::getTargetElement(&this->super_SVGURIReference,document);
  if ((tuple<lunasvg::SVGElement_*,_std::default_delete<lunasvg::SVGElement>_>)
      newElement._M_t.
      super___uniq_ptr_impl<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_>._M_t.
      super__Tuple_impl<0UL,_lunasvg::SVGElement_*,_std::default_delete<lunasvg::SVGElement>_>.
      super__Head_base<0UL,_lunasvg::SVGElement_*,_false>._M_head_impl !=
      (_Head_base<0UL,_lunasvg::SVGElement_*,_false>)0x0) {
    cloneTargetElement((SVGUseElement *)local_20,(SVGElement *)this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
    if (bVar1) {
      std::unique_ptr<lunasvg::SVGNode,std::default_delete<lunasvg::SVGNode>>::
      unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>,void>
                ((unique_ptr<lunasvg::SVGNode,std::default_delete<lunasvg::SVGNode>> *)&local_28,
                 (unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> *)
                 local_20);
      SVGElement::addChild((SVGElement *)this,&local_28);
      std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::~unique_ptr
                (&local_28);
    }
    std::unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_>::~unique_ptr
              ((unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> *)
               local_20);
  }
  SVGElement::build((SVGElement *)this);
  return;
}

Assistant:

void SVGUseElement::build()
{
    if(auto targetElement = getTargetElement(document())) {
        if(auto newElement = cloneTargetElement(targetElement)) {
            addChild(std::move(newElement));
        }
    }

    SVGGraphicsElement::build();
}